

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

int ikcp_input(ikcpcb *kcp,char *data,long size)

{
  IUINT32 *pIVar1;
  IUINT32 *__src;
  IQUEUEHEAD *pIVar2;
  byte bVar3;
  byte bVar4;
  IUINT32 IVar5;
  IUINT32 IVar6;
  IUINT32 IVar7;
  uint uVar8;
  uint uVar9;
  IQUEUEHEAD *pIVar10;
  IUINT32 *__ptr;
  bool bVar11;
  uint uVar12;
  IUINT32 *pIVar13;
  IUINT32 *pIVar14;
  ulong uVar15;
  IKCPSEG *newseg;
  IQUEUEHEAD *pIVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong __n;
  long lVar22;
  uint local_6c;
  
  IVar5 = kcp->snd_una;
  if (((kcp->logmask & 2) != 0) && (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)
     ) {
    ikcp_log(kcp,2,"[RI] %d bytes",size);
  }
  iVar17 = -1;
  if (0x17 < (int)size && data != (char *)0x0) {
    pIVar2 = &kcp->snd_buf;
    pIVar1 = &kcp->snd_nxt;
    local_6c = 0;
    bVar11 = false;
    pIVar13 = pIVar1;
    do {
      iVar19 = 3;
      if (0x17 < size) {
        IVar6 = *(IUINT32 *)data;
        iVar19 = 1;
        if (IVar6 == kcp->conv) {
          uVar12 = *(uint *)((long)data + 0x14);
          __n = (ulong)uVar12;
          __src = (IUINT32 *)((long)data + 0x18);
          lVar22 = size + -0x18;
          size = lVar22 - __n;
          iVar19 = 1;
          if (lVar22 < (long)__n) {
            pIVar13 = (IUINT32 *)0xfffffffe;
            size = lVar22;
            data = (char *)__src;
          }
          else {
            bVar3 = (byte)*(IUINT32 *)((long)data + 4);
            if ((byte)(bVar3 + 0xab) < 0xfc) {
switchD_00149de5_default:
              pIVar13 = (IUINT32 *)0xfffffffd;
              size = lVar22;
              data = (char *)__src;
            }
            else {
              bVar4 = *(byte *)((long)data + 5);
              uVar8 = *(uint *)((long)data + 8);
              uVar9 = *(uint *)((long)data + 0xc);
              IVar7 = *(IUINT32 *)((long)data + 0x10);
              uVar20 = (uint)*(ushort *)((long)data + 6);
              kcp->rmt_wnd = uVar20;
              pIVar16 = (kcp->snd_buf).next;
              while ((pIVar16 != pIVar2 && (0 < (int)(IVar7 - *(int *)((long)&pIVar16[2].next + 4)))
                     )) {
                pIVar10 = pIVar16->next;
                pIVar10->prev = pIVar16->prev;
                pIVar16->prev->next = pIVar10;
                pIVar16->next = (IQUEUEHEAD *)0x0;
                pIVar16->prev = (IQUEUEHEAD *)0x0;
                if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                  free(pIVar16);
                }
                else {
                  (*ikcp_free_hook)(pIVar16);
                }
                kcp->nsnd_buf = kcp->nsnd_buf - 1;
                pIVar16 = pIVar10;
              }
              pIVar16 = (kcp->snd_buf).next;
              pIVar14 = (IUINT32 *)((long)&pIVar16[2].next + 4);
              if (pIVar16 == pIVar2) {
                pIVar14 = pIVar1;
              }
              kcp->snd_una = *pIVar14;
              switch((uint)bVar3) {
              case 0x51:
                if (((kcp->logmask & 0x10) != 0) &&
                   (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
                  ikcp_log(kcp,0x10,"input psh: sn=%lu ts=%lu",(ulong)uVar9,(ulong)uVar8);
                }
                if ((int)(uVar9 - (kcp->rcv_nxt + kcp->rcv_wnd)) < 0) {
                  uVar18 = kcp->ackcount + 1;
                  if (kcp->ackblock < uVar18) {
                    uVar15 = 8;
                    do {
                      uVar21 = uVar15;
                      uVar15 = uVar21 * 2;
                    } while (uVar21 < uVar18);
                    if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
                      pIVar14 = (IUINT32 *)malloc(uVar21 * 8);
                    }
                    else {
                      pIVar14 = (IUINT32 *)(*ikcp_malloc_hook)(uVar21 * 8);
                    }
                    if (pIVar14 == (IUINT32 *)0x0) {
                      __assert_fail("acklist != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                                    ,0x283,"void ikcp_ack_push(ikcpcb *, IUINT32, IUINT32)");
                    }
                    __ptr = kcp->acklist;
                    if (__ptr != (IUINT32 *)0x0) {
                      if (kcp->ackcount != 0) {
                        uVar15 = 0;
                        do {
                          pIVar14[uVar15 * 2] = __ptr[uVar15 * 2];
                          pIVar14[uVar15 * 2 + 1] = __ptr[uVar15 * 2 + 1];
                          uVar15 = uVar15 + 1;
                        } while (uVar15 < kcp->ackcount);
                      }
                      if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                        free(__ptr);
                      }
                      else {
                        (*ikcp_free_hook)(__ptr);
                      }
                    }
                    kcp->acklist = pIVar14;
                    kcp->ackblock = (IUINT32)uVar21;
                  }
                  pIVar14 = kcp->acklist;
                  uVar15 = (ulong)(kcp->ackcount * 2);
                  pIVar14[uVar15] = uVar9;
                  pIVar14[uVar15 + 1] = uVar8;
                  kcp->ackcount = kcp->ackcount + 1;
                  if (-1 < (int)(uVar9 - kcp->rcv_nxt)) {
                    if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
                      newseg = (IKCPSEG *)malloc((long)(int)uVar12 + 0x48U);
                    }
                    else {
                      newseg = (IKCPSEG *)(*ikcp_malloc_hook)((long)(int)uVar12 + 0x48U);
                    }
                    newseg->conv = IVar6;
                    newseg->cmd = (uint)bVar3;
                    newseg->frg = (uint)bVar4;
                    newseg->wnd = uVar20;
                    newseg->ts = uVar8;
                    newseg->sn = uVar9;
                    newseg->una = IVar7;
                    newseg->len = uVar12;
                    if (uVar12 != 0) {
                      memcpy(newseg->data,__src,__n);
                    }
                    ikcp_parse_data(kcp,newseg);
                  }
                }
                break;
              case 0x52:
                uVar12 = kcp->current - uVar8;
                if (-1 < (int)uVar12) {
                  iVar17 = kcp->rx_srtt;
                  if (iVar17 == 0) {
                    kcp->rx_srtt = uVar12;
                    kcp->rx_rttval = uVar12 >> 1;
                  }
                  else {
                    uVar18 = uVar12 - iVar17;
                    uVar20 = -uVar18;
                    if (0 < (int)uVar18) {
                      uVar20 = uVar18;
                    }
                    lVar22 = (long)kcp->rx_rttval * 3;
                    uVar21 = lVar22 + (ulong)uVar20;
                    uVar15 = (ulong)uVar20 + lVar22 + 3;
                    if (-1 < (long)uVar21) {
                      uVar15 = uVar21;
                    }
                    kcp->rx_rttval = (IINT32)(uVar15 >> 2);
                    iVar19 = iVar17 * 7 + uVar12;
                    iVar17 = iVar17 * 7 + uVar12 + 7;
                    if (-1 < iVar19) {
                      iVar17 = iVar19;
                    }
                    iVar17 = iVar17 >> 3;
                    if (iVar19 < 8) {
                      iVar17 = 1;
                    }
                    kcp->rx_srtt = iVar17;
                  }
                  uVar12 = kcp->rx_rttval << 2;
                  if (uVar12 < kcp->interval) {
                    uVar12 = kcp->interval;
                  }
                  uVar12 = uVar12 + kcp->rx_srtt;
                  if (uVar12 < (uint)kcp->rx_minrto) {
                    uVar12 = kcp->rx_minrto;
                  }
                  if (59999 < uVar12) {
                    uVar12 = 60000;
                  }
                  kcp->rx_rto = uVar12;
                }
                if ((-1 < (int)(uVar9 - kcp->snd_una)) && ((int)(uVar9 - kcp->snd_nxt) < 0)) {
                  do {
                    if (pIVar16 == pIVar2) break;
                    pIVar10 = pIVar16->next;
                    uVar12 = *(uint *)((long)&pIVar16[2].next + 4);
                    if (uVar9 == uVar12) {
                      pIVar10->prev = pIVar16->prev;
                      pIVar16->prev->next = pIVar10;
                      pIVar16->next = (IQUEUEHEAD *)0x0;
                      pIVar16->prev = (IQUEUEHEAD *)0x0;
                      if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                        free(pIVar16);
                      }
                      else {
                        (*ikcp_free_hook)(pIVar16);
                      }
                      kcp->nsnd_buf = kcp->nsnd_buf - 1;
                      break;
                    }
                    pIVar16 = pIVar10;
                  } while (-1 < (int)(uVar9 - uVar12));
                }
                pIVar16 = (kcp->snd_buf).next;
                pIVar14 = (IUINT32 *)((long)&pIVar16[2].next + 4);
                if (pIVar16 == pIVar2) {
                  pIVar14 = pIVar1;
                }
                if (0 < (int)(uVar9 - local_6c)) {
                  local_6c = uVar9;
                }
                if (!bVar11) {
                  local_6c = uVar9;
                }
                kcp->snd_una = *pIVar14;
                if ((kcp->logmask & 0x20) == 0) {
                  bVar11 = true;
                }
                else {
                  bVar11 = true;
                  if (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0) {
                    ikcp_log(kcp,0x10,"input ack: sn=%lu rtt=%ld rto=%ld",(ulong)uVar9,
                             (long)(int)(kcp->current - uVar8),(long)kcp->rx_rto);
                  }
                }
                break;
              case 0x53:
                *(byte *)&kcp->probe = (byte)kcp->probe | 2;
                if (((kcp->logmask & 0x40) != 0) &&
                   (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
                  ikcp_log(kcp,0x40,"input probe");
                }
                break;
              case 0x54:
                if (((kcp->logmask & 0x80) != 0) &&
                   (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
                  ikcp_log(kcp,0x80,"input wins: %lu",(ulong)uVar20);
                }
                break;
              default:
                goto switchD_00149de5_default;
              }
              data = (char *)((long)__src + __n);
              iVar19 = 0;
              pIVar13 = (IUINT32 *)((ulong)pIVar13 & 0xffffffff);
            }
          }
        }
        else {
          data = (char *)((long)data + 4);
          pIVar13 = (IUINT32 *)0xffffffff;
        }
      }
      iVar17 = (int)pIVar13;
    } while (iVar19 == 0);
    if (iVar19 == 3) {
      if (((bVar11) && (-1 < (int)(local_6c - kcp->snd_una))) &&
         ((int)(local_6c - kcp->snd_nxt) < 0)) {
        pIVar16 = (kcp->snd_buf).next;
        do {
          if (pIVar16 == pIVar2) break;
          uVar12 = *(uint *)((long)&pIVar16[2].next + 4);
          iVar17 = local_6c - uVar12;
          if ((local_6c != uVar12) && (-1 < iVar17)) {
            *(int *)&pIVar16[3].prev = *(int *)&pIVar16[3].prev + 1;
          }
          pIVar16 = pIVar16->next;
        } while (-1 < iVar17);
      }
      iVar17 = 0;
      if (0 < (int)(kcp->snd_una - IVar5)) {
        uVar12 = kcp->rmt_wnd;
        uVar8 = kcp->cwnd;
        if (uVar8 < uVar12) {
          uVar9 = kcp->mss;
          if (uVar8 < kcp->ssthresh) {
            kcp->cwnd = uVar8 + 1;
            kcp->incr = kcp->incr + uVar9;
          }
          else {
            if (kcp->incr < uVar9) {
              kcp->incr = uVar9;
            }
            uVar20 = (uVar9 >> 4) + kcp->incr + (uVar9 * uVar9) / kcp->incr;
            kcp->incr = uVar20;
            if (uVar9 * (uVar8 + 1) <= uVar20) {
              kcp->cwnd = uVar8 + 1;
            }
          }
          if (uVar12 < kcp->cwnd) {
            kcp->cwnd = uVar12;
            kcp->incr = uVar9 * uVar12;
          }
        }
        iVar17 = 0;
      }
    }
  }
  return iVar17;
}

Assistant:

int ikcp_input(ikcpcb *kcp, const char *data, long size)
{
	IUINT32 una = kcp->snd_una;
	IUINT32 maxack = 0;
	int flag = 0;

	if (ikcp_canlog(kcp, IKCP_LOG_INPUT)) {
		ikcp_log(kcp, IKCP_LOG_INPUT, "[RI] %d bytes", size);
	}

	if (data == NULL || (int)size < (int)IKCP_OVERHEAD) return -1;

	while (1) {
		IUINT32 ts, sn, len, una, conv;
		IUINT16 wnd;
		IUINT8 cmd, frg;
		IKCPSEG *seg;

		if (size < (int)IKCP_OVERHEAD) break;

		data = ikcp_decode32u(data, &conv);
		if (conv != kcp->conv) return -1;

		data = ikcp_decode8u(data, &cmd);
		data = ikcp_decode8u(data, &frg);
		data = ikcp_decode16u(data, &wnd);
		data = ikcp_decode32u(data, &ts);
		data = ikcp_decode32u(data, &sn);
		data = ikcp_decode32u(data, &una);
		data = ikcp_decode32u(data, &len);

		size -= IKCP_OVERHEAD;

		if ((long)size < (long)len) return -2;

		if (cmd != IKCP_CMD_PUSH && cmd != IKCP_CMD_ACK &&
			cmd != IKCP_CMD_WASK && cmd != IKCP_CMD_WINS) 
			return -3;

		kcp->rmt_wnd = wnd;
		ikcp_parse_una(kcp, una);
		ikcp_shrink_buf(kcp);

		if (cmd == IKCP_CMD_ACK) {
			if (_itimediff(kcp->current, ts) >= 0) {
				ikcp_update_ack(kcp, _itimediff(kcp->current, ts));
			}
			ikcp_parse_ack(kcp, sn);
			ikcp_shrink_buf(kcp);
			if (flag == 0) {
				flag = 1;
				maxack = sn;
			}	else {
				if (_itimediff(sn, maxack) > 0) {
					maxack = sn;
				}
			}
			if (ikcp_canlog(kcp, IKCP_LOG_IN_ACK)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input ack: sn=%lu rtt=%ld rto=%ld", sn, 
					(long)_itimediff(kcp->current, ts),
					(long)kcp->rx_rto);
			}
		}
		else if (cmd == IKCP_CMD_PUSH) {
			if (ikcp_canlog(kcp, IKCP_LOG_IN_DATA)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input psh: sn=%lu ts=%lu", sn, ts);
			}
			if (_itimediff(sn, kcp->rcv_nxt + kcp->rcv_wnd) < 0) {
				ikcp_ack_push(kcp, sn, ts);
				if (_itimediff(sn, kcp->rcv_nxt) >= 0) {
					seg = ikcp_segment_new(kcp, len);
					seg->conv = conv;
					seg->cmd = cmd;
					seg->frg = frg;
					seg->wnd = wnd;
					seg->ts = ts;
					seg->sn = sn;
					seg->una = una;
					seg->len = len;

					if (len > 0) {
						memcpy(seg->data, data, len);
					}

					ikcp_parse_data(kcp, seg);
				}
			}
		}
		else if (cmd == IKCP_CMD_WASK) {
			// ready to send back IKCP_CMD_WINS in ikcp_flush
			// tell remote my window size
			kcp->probe |= IKCP_ASK_TELL;
			if (ikcp_canlog(kcp, IKCP_LOG_IN_PROBE)) {
				ikcp_log(kcp, IKCP_LOG_IN_PROBE, "input probe");
			}
		}
		else if (cmd == IKCP_CMD_WINS) {
			// do nothing
			if (ikcp_canlog(kcp, IKCP_LOG_IN_WINS)) {
				ikcp_log(kcp, IKCP_LOG_IN_WINS,
					"input wins: %lu", (IUINT32)(wnd));
			}
		}
		else {
			return -3;
		}

		data += len;
		size -= len;
	}

	if (flag != 0) {
		ikcp_parse_fastack(kcp, maxack);
	}

	if (_itimediff(kcp->snd_una, una) > 0) {
		if (kcp->cwnd < kcp->rmt_wnd) {
			IUINT32 mss = kcp->mss;
			if (kcp->cwnd < kcp->ssthresh) {
				kcp->cwnd++;
				kcp->incr += mss;
			}	else {
				if (kcp->incr < mss) kcp->incr = mss;
				kcp->incr += (mss * mss) / kcp->incr + (mss / 16);
				if ((kcp->cwnd + 1) * mss <= kcp->incr) {
					kcp->cwnd++;
				}
			}
			if (kcp->cwnd > kcp->rmt_wnd) {
				kcp->cwnd = kcp->rmt_wnd;
				kcp->incr = kcp->rmt_wnd * mss;
			}
		}
	}

	return 0;
}